

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_qaddsub(DisasContext_conflict1 *s,arg_rrr *a,_Bool add,_Bool doub)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 retval;
  TCGv_i32 retval_00;
  uintptr_t o;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    if ((short)s->features < 0) goto LAB_005f4815;
  }
  else if ((s->features >> 0x22 & 1) != 0) {
LAB_005f4815:
    retval = load_reg(s,a->rm);
    retval_00 = load_reg(s,a->rn);
    if (doub) {
      gen_helper_add_saturate(tcg_ctx,retval_00,tcg_ctx->cpu_env,retval_00,retval_00);
    }
    if (add) {
      gen_helper_add_saturate(tcg_ctx,retval,tcg_ctx->cpu_env,retval,retval_00);
    }
    else {
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_40 = (TCGTemp *)(retval + (long)tcg_ctx);
      local_38 = retval_00 + (long)&tcg_ctx->pool_cur;
      tcg_gen_callN_aarch64(tcg_ctx,helper_sub_saturate_aarch64,local_40,3,&local_48);
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval_00 + (long)tcg_ctx));
    store_reg(s,a->rd,retval);
    return true;
  }
  return false;
}

Assistant:

static bool op_qaddsub(DisasContext *s, arg_rrr *a, bool add, bool doub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_5TE) {
        return false;
    }

    t0 = load_reg(s, a->rm);
    t1 = load_reg(s, a->rn);
    if (doub) {
        gen_helper_add_saturate(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t1);
    }
    if (add) {
        gen_helper_add_saturate(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
    } else {
        gen_helper_sub_saturate(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
    }
    tcg_temp_free_i32(tcg_ctx, t1);
    store_reg(s, a->rd, t0);
    return true;
}